

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

void __thiscall QPDF::writeHSharedObject(QPDF *this,BitWriter *w)

{
  vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *vec;
  int nitems;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  unsigned_long_long val;
  ulong uVar5;
  string local_68;
  vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *local_48;
  BitWriter *local_40;
  QPDF *local_38;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  local_38 = this;
  BitWriter::writeBitsInt(w,((_Var1._M_head_impl)->shared_object_hints).first_shared_obj,0x20);
  val = *(qpdf_offset_t *)((long)&(_Var1._M_head_impl)->shared_object_hints + 8);
  if ((long)val < 0) {
    QIntC::IntConverter<long_long,_unsigned_long_long,_true,_false>::error(val);
    val = *(qpdf_offset_t *)((long)&(_Var1._M_head_impl)->shared_object_hints + 8);
  }
  BitWriter::writeBits(w,val,0x20);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x10),0x20);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x14),0x20);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x18),0x10);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x1c),0x20);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x20),0x10);
  vec = (vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
        ((long)&(_Var1._M_head_impl)->shared_object_hints + 0x28);
  nitems = *(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x14);
  uVar5 = 0;
  write_vector_int<QPDF::HSharedObjectEntry,int>
            (w,nitems,vec,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x20),0);
  lVar4 = 4;
  local_48 = vec;
  local_40 = w;
  write_vector_int<QPDF::HSharedObjectEntry,int>(w,nitems,vec,1,4);
  while( true ) {
    if (nitems < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(nitems);
    }
    if ((long)nitems == uVar5) break;
    lVar2 = *(long *)&((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                        *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x28))->
                      super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
    ;
    uVar3 = ((long)*(pointer *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x30) - lVar2 >>
            2) * -0x5555555555555555;
    if (uVar3 < uVar5 || uVar3 - uVar5 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5);
    }
    if (*(int *)(lVar2 + lVar4) != 0) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,
                 "found unexpected signature present while writing linearization data","");
      stopOnError(local_38,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0xc;
  }
  write_vector_int<QPDF::HSharedObjectEntry,int>
            (local_40,nitems,local_48,
             *(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x18),8);
  return;
}

Assistant:

void
QPDF::writeHSharedObject(BitWriter& w)
{
    HSharedObject& t = m->shared_object_hints;

    w.writeBitsInt(t.first_shared_obj, 32);         // 1
    w.writeBits(toULL(t.first_shared_offset), 32);  // 2
    w.writeBitsInt(t.nshared_first_page, 32);       // 3
    w.writeBitsInt(t.nshared_total, 32);            // 4
    w.writeBitsInt(t.nbits_nobjects, 16);           // 5
    w.writeBitsInt(t.min_group_length, 32);         // 6
    w.writeBitsInt(t.nbits_delta_group_length, 16); // 7

    QTC::TC(
        "qpdf",
        "QPDF lin write nshared_total > nshared_first_page",
        (t.nshared_total > t.nshared_first_page) ? 1 : 0);

    int nitems = t.nshared_total;
    std::vector<HSharedObjectEntry>& entries = t.entries;

    write_vector_int(
        w, nitems, entries, t.nbits_delta_group_length, &HSharedObjectEntry::delta_group_length);
    write_vector_int(w, nitems, entries, 1, &HSharedObjectEntry::signature_present);
    for (size_t i = 0; i < toS(nitems); ++i) {
        // If signature were present, we'd have to write a 128-bit hash.
        if (entries.at(i).signature_present != 0) {
            stopOnError("found unexpected signature present while writing linearization data");
        }
    }
    write_vector_int(w, nitems, entries, t.nbits_nobjects, &HSharedObjectEntry::nobjects_minus_one);
}